

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkSweep(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x263,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
  }
  iVar3 = Abc_NtkToBdd(pNtk);
  if (iVar3 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    iVar3 = 1;
  }
  else {
    iVar3 = pNtk->nObjCounts[7];
    Abc_NtkCleanup(pNtk,0);
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 100;
    __ptr[1] = 0;
    pvVar5 = malloc(800);
    *(void **)(__ptr + 2) = pvVar5;
    pVVar8 = pNtk->vObjs;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pvVar5 = pVVar8->pArray[lVar11];
        if (((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) &&
           (*(int *)((long)pvVar5 + 0x1c) < 2)) {
          uVar10 = __ptr[1];
          uVar9 = *__ptr;
          if (uVar10 == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar6 = malloc(0x80);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar13 = 0x10;
            }
            else {
              uVar13 = uVar9 * 2;
              if ((int)uVar13 <= (int)uVar9) goto LAB_00316069;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar6 = malloc((ulong)uVar9 << 4);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar9 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = uVar13;
          }
LAB_00316069:
          __ptr[1] = uVar10 + 1;
          *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar10 * 8) = pvVar5;
        }
        lVar11 = lVar11 + 1;
        pVVar8 = pNtk->vObjs;
      } while (lVar11 < pVVar8->nSize);
    }
    uVar10 = __ptr[1];
    if (0 < (int)uVar10) {
      pvVar5 = *(void **)(__ptr + 2);
      do {
        uVar9 = uVar10 - 1;
        pAVar1 = *(Abc_Obj_t **)((long)pvVar5 + (ulong)uVar9 * 8);
        if (((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) &&
           (pAVar7 = Abc_NodeFindNonCoFanout(pAVar1), pAVar7 != (Abc_Obj_t *)0x0)) {
          if ((*(uint *)&pAVar7->field_0x14 & 0xf) != 7) {
            *(void **)(__ptr + 2) = pvVar5;
            __ptr[1] = uVar9;
            __assert_fail("Abc_ObjIsNode(pFanout)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                          ,0x280,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
          }
          iVar4 = (pAVar1->vFanins).nSize;
          if (iVar4 == 1) {
            pAVar2 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
            iVar4 = Abc_NodeIsInv(pAVar1);
            if (iVar4 != 0) {
              Abc_NodeComplementInput(pAVar7,pAVar1);
            }
            Abc_ObjPatchFanin(pAVar7,pAVar1,pAVar2);
          }
          else {
            if (iVar4 != 0) {
              *(void **)(__ptr + 2) = pvVar5;
              __ptr[1] = uVar9;
              __assert_fail("Abc_ObjFaninNum(pNode) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                            ,0x286,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
            }
            iVar4 = Abc_NodeIsConst0(pAVar1);
            Abc_NodeConstantInput(pAVar7,pAVar1,iVar4);
          }
          Abc_NodeRemoveDupFanins(pAVar7);
          Abc_NodeMinimumBase(pAVar7);
          if ((pAVar7->vFanins).nSize < 2) {
            uVar13 = *__ptr;
            if (uVar9 == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (pvVar5 == (void *)0x0) {
                  pvVar5 = malloc(0x80);
                }
                else {
                  pvVar5 = realloc(pvVar5,0x80);
                }
                uVar12 = 0x10;
              }
              else {
                uVar12 = uVar13 * 2;
                if ((int)uVar12 <= (int)uVar13) goto LAB_003161dd;
                if (pvVar5 == (void *)0x0) {
                  pvVar5 = malloc((ulong)uVar13 << 4);
                }
                else {
                  pvVar5 = realloc(pvVar5,(ulong)uVar13 << 4);
                }
              }
              *__ptr = uVar12;
            }
LAB_003161dd:
            *(Abc_Obj_t **)((long)pvVar5 + (long)(int)uVar9 * 8) = pAVar7;
            uVar9 = uVar10;
          }
          if ((pAVar1->vFanouts).nSize < 1) {
            Abc_NtkDeleteObj_rec(pAVar1,1);
          }
          else {
            uVar10 = *__ptr;
            if (uVar9 == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (pvVar5 == (void *)0x0) {
                  pvVar5 = malloc(0x80);
                }
                else {
                  pvVar5 = realloc(pvVar5,0x80);
                }
                uVar13 = 0x10;
              }
              else {
                uVar13 = uVar10 * 2;
                if ((int)uVar13 <= (int)uVar10) goto LAB_00316262;
                if (pvVar5 == (void *)0x0) {
                  pvVar5 = malloc((ulong)uVar10 << 4);
                }
                else {
                  pvVar5 = realloc(pvVar5,(ulong)uVar10 << 4);
                }
              }
              *__ptr = uVar13;
            }
LAB_00316262:
            *(Abc_Obj_t **)((long)pvVar5 + (long)(int)uVar9 * 8) = pAVar1;
            uVar9 = uVar9 + 1;
          }
        }
        uVar10 = uVar9;
      } while (0 < (int)uVar10);
      *(void **)(__ptr + 2) = pvVar5;
    }
    __ptr[1] = uVar10;
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    pVVar8 = pNtk->vCos;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar8->pArray[lVar11];
        pAVar7 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
        if ((((pAVar7->vFanins).nSize == 1) &&
            (pAVar2 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray],
            (pAVar2->vFanouts).nSize == 1)) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
          iVar4 = Abc_NodeIsInv(pAVar7);
          if (iVar4 != 0) {
            *(byte *)&pAVar2->field_5 = *(byte *)&pAVar2->field_5 ^ 1;
          }
          Abc_ObjPatchFanin(pAVar1,pAVar7,pAVar2);
        }
        lVar11 = lVar11 + 1;
        pVVar8 = pNtk->vCos;
      } while (lVar11 < pVVar8->nSize);
    }
    Abc_NtkCleanup(pNtk,0);
    if (fVerbose != 0) {
      printf("Sweep removed %d nodes.\n",(ulong)(uint)(iVar3 - pNtk->nObjCounts[7]));
    }
    iVar3 = iVar3 - pNtk->nObjCounts[7];
  }
  return iVar3;
}

Assistant:

int Abc_NtkSweep( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanout, * pDriver;
    int i, nNodesOld;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 1;
    }
    // perform cleanup
    nNodesOld = Abc_NtkNodeNum(pNtk);
    Abc_NtkCleanup( pNtk, 0 );
    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    // collect sweepable nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( Abc_ObjFaninNum(pNode) < 2 )
            Vec_PtrPush( vNodes, pNode );
    // sweep the nodes
    while ( Vec_PtrSize(vNodes) > 0 )
    {
        // get any sweepable node
        pNode = (Abc_Obj_t *)Vec_PtrPop(vNodes);
        if ( !Abc_ObjIsNode(pNode) )
            continue;
        // get any non-CO fanout of this node
        pFanout = Abc_NodeFindNonCoFanout(pNode);
        if ( pFanout == NULL )
            continue;
        assert( Abc_ObjIsNode(pFanout) );
        // transform the function of the fanout
        if ( Abc_ObjFaninNum(pNode) == 0 )
            Abc_NodeConstantInput( pFanout, pNode, Abc_NodeIsConst0(pNode) );
        else 
        {
            assert( Abc_ObjFaninNum(pNode) == 1 );
            pDriver = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsInv(pNode) )
                Abc_NodeComplementInput( pFanout, pNode );
            Abc_ObjPatchFanin( pFanout, pNode, pDriver );
        }
        Abc_NodeRemoveDupFanins( pFanout );
        Abc_NodeMinimumBase( pFanout );
        // check if the fanout should be added
        if ( Abc_ObjFaninNum(pFanout) < 2 )
            Vec_PtrPush( vNodes, pFanout );
        // check if the node has other fanouts
        if ( Abc_ObjFanoutNum(pNode) > 0 )
            Vec_PtrPush( vNodes, pNode );
        else
            Abc_NtkDeleteObj_rec( pNode, 1 );
    }
    Vec_PtrFree( vNodes );
    // sweep a node into its CO fanout if all of this is true:
    // (a) this node is a single-input node
    // (b) the driver of the node has only one fanout (this node)
    // (c) the driver is a node
    Abc_NtkForEachCo( pNtk, pFanout, i )
    {
        pNode = Abc_ObjFanin0(pFanout);
        if ( Abc_ObjFaninNum(pNode) != 1 )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( !(Abc_ObjFanoutNum(pDriver) == 1 && Abc_ObjIsNode(pDriver)) )
            continue;
        // trasform this CO
        if ( Abc_NodeIsInv(pNode) )
            pDriver->pData = Cudd_Not(pDriver->pData);
        Abc_ObjPatchFanin( pFanout, pNode, pDriver );
    }
    // perform cleanup
    Abc_NtkCleanup( pNtk, 0 );
    // report
    if ( fVerbose )
        printf( "Sweep removed %d nodes.\n", nNodesOld - Abc_NtkNodeNum(pNtk) );
    return nNodesOld - Abc_NtkNodeNum(pNtk);
}